

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qfontcombobox.cpp
# Opt level: O3

void QFontComboBox::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  WritingSystem *pWVar1;
  QFontComboBoxPrivate *this;
  void *pvVar2;
  WritingSystem WVar3;
  QFont *font;
  long in_FS_OFFSET;
  void *local_28;
  void *local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  switch(_c) {
  case InvokeMetaMethod:
    if (_id == 1) {
      font = (QFont *)_a[1];
LAB_004071d0:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        setCurrentFont((QFontComboBox *)_o,font);
        return;
      }
      goto LAB_00407275;
    }
    if (_id == 0) {
      local_20 = _a[1];
      local_28 = (void *)0x0;
      QMetaObject::activate(_o,&staticMetaObject,0,&local_28);
    }
    break;
  case ReadProperty:
    pWVar1 = (WritingSystem *)*_a;
    if (_id == 2) {
      QFont::QFont((QFont *)&local_28,(QFont *)(*(long *)(_o + 8) + 0x358));
      pvVar2 = *(void **)pWVar1;
      *(void **)pWVar1 = local_28;
      WVar3 = pWVar1[2];
      pWVar1[2] = (WritingSystem)local_20;
      local_20 = (void *)CONCAT44(local_20._4_4_,WVar3);
      local_28 = pvVar2;
      QFont::~QFont((QFont *)&local_28);
    }
    else {
      if (_id == 1) {
        WVar3 = *(WritingSystem *)(*(long *)(_o + 8) + 0x350);
      }
      else {
        if (_id != 0) break;
        WVar3 = writingSystem((QFontComboBox *)_o);
      }
      *pWVar1 = WVar3;
    }
    break;
  case WriteProperty:
    font = (QFont *)*_a;
    if (_id == 2) goto LAB_004071d0;
    if (_id == 1) {
      this = *(QFontComboBoxPrivate **)(_o + 8);
      (this->filters).super_QFlagsStorageHelper<QFontComboBox::FontFilter,_4>.
      super_QFlagsStorage<QFontComboBox::FontFilter>.i = *(WritingSystem *)font;
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        QFontComboBoxPrivate::updateModel(this);
        return;
      }
      goto LAB_00407275;
    }
    if (_id == 0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        setWritingSystem((QFontComboBox *)_o,*(WritingSystem *)font);
        return;
      }
      goto LAB_00407275;
    }
    break;
  case IndexOfMethod:
    if ((*_a[1] == currentFontChanged) && (*(long *)((long)_a[1] + 8) == 0)) {
      *(undefined4 *)*_a = 0;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
LAB_00407275:
  __stack_chk_fail();
}

Assistant:

void QFontComboBox::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QFontComboBox *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->currentFontChanged((*reinterpret_cast< std::add_pointer_t<QFont>>(_a[1]))); break;
        case 1: _t->setCurrentFont((*reinterpret_cast< std::add_pointer_t<QFont>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QFontComboBox::*)(const QFont & )>(_a, &QFontComboBox::currentFontChanged, 0))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<QFontDatabase::WritingSystem*>(_v) = _t->writingSystem(); break;
        case 1: QtMocHelpers::assignFlags<FontFilters>(_v, _t->fontFilters()); break;
        case 2: *reinterpret_cast<QFont*>(_v) = _t->currentFont(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setWritingSystem(*reinterpret_cast<QFontDatabase::WritingSystem*>(_v)); break;
        case 1: _t->setFontFilters(*reinterpret_cast<FontFilters*>(_v)); break;
        case 2: _t->setCurrentFont(*reinterpret_cast<QFont*>(_v)); break;
        default: break;
        }
    }
}